

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O1

void __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::deadline_timer_service
          (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this,execution_context *context)

{
  timer_scheduler *ptVar1;
  key local_28;
  
  (this->
  super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
  ).super_service.key_.type_info_ = (type_info *)0x0;
  (this->
  super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
  ).super_service.key_.id_ = (id *)0x0;
  (this->
  super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
  ).super_service.owner_ = context;
  (this->
  super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
  ).super_service.next_ = (service *)0x0;
  (this->
  super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
  ).super_service._vptr_service = (_func_int **)&PTR__deadline_timer_service_0035a2e0;
  (this->timer_queue_).super_timer_queue_base.next_ = (timer_queue_base *)0x0;
  (this->timer_queue_).super_timer_queue_base._vptr_timer_queue_base =
       (_func_int **)&PTR__timer_queue_0035a340;
  (this->timer_queue_).timers_ = (per_timer_data *)0x0;
  (this->timer_queue_).heap_.
  super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timer_queue_).heap_.
  super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timer_queue_).heap_.
  super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.type_info_ = (type_info *)&typeid_wrapper<asio::detail::epoll_reactor>::typeinfo;
  local_28.id_ = (id *)0x0;
  ptVar1 = (timer_scheduler *)
           service_registry::do_use_service
                     (context->service_registry_,&local_28,
                      service_registry::create<asio::detail::epoll_reactor,asio::execution_context>,
                      context->service_registry_->owner_);
  this->scheduler_ = ptVar1;
  scheduler::init_task(ptVar1->scheduler_);
  epoll_reactor::
  add_timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
            (this->scheduler_,&this->timer_queue_);
  return;
}

Assistant:

deadline_timer_service(execution_context& context)
    : execution_context_service_base<
        deadline_timer_service<Time_Traits> >(context),
      scheduler_(asio::use_service<timer_scheduler>(context))
  {
    scheduler_.init_task();
    scheduler_.add_timer_queue(timer_queue_);
  }